

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_trd.cpp
# Opt level: O3

int ReturnWithError(char *errorText,path *fname,FILE *fileToClose)

{
  pointer pcVar1;
  int extraout_EAX;
  int extraout_EAX_00;
  int iVar2;
  long *local_38 [2];
  long local_28 [2];
  
  if (fileToClose != (FILE *)0x0) {
    fclose((FILE *)fileToClose);
  }
  pcVar1 = (fname->_M_pathname)._M_dataplus._M_p;
  local_38[0] = local_28;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_38,pcVar1,pcVar1 + (fname->_M_pathname)._M_string_length);
  Error(errorText,(char *)local_38[0],IF_FIRST);
  iVar2 = extraout_EAX;
  if (local_38[0] != local_28) {
    operator_delete(local_38[0],local_28[0] + 1);
    iVar2 = extraout_EAX_00;
  }
  return iVar2;
}

Assistant:

static int ReturnWithError(const char* errorText, const std::filesystem::path & fname, FILE* fileToClose) {
	if (nullptr != fileToClose) fclose(fileToClose);
	Error(errorText, fname.string().c_str(), IF_FIRST);
	return 0;
}